

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O2

void do_work(int type,int op)

{
  GlobalArray *pGVar1;
  GlobalArray *g_v;
  GlobalArray *pGVar2;
  GlobalArray *g_c;
  int dims [2];
  int vdim;
  int hi [2];
  int lo [2];
  
  dims[0] = 4;
  dims[1] = 6;
  lo[0] = 1;
  lo[1] = 1;
  hi[0] = 3;
  hi[1] = 5;
  switch(op) {
  case 1:
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    test_shift_diagonal(g_v);
    goto LAB_001067cb;
  case 2:
    pGVar1 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    vdim = dims[1];
    if (dims[0] < dims[1]) {
      vdim = dims[0];
    }
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,1,&vdim,"V",(int *)0x0);
    test_set_diagonal(pGVar1,g_v);
    break;
  case 3:
    pGVar1 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    vdim = dims[1];
    if (dims[0] < dims[1]) {
      vdim = dims[0];
    }
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,1,&vdim,"V",(int *)0x0);
    test_add_diagonal(pGVar1,g_v);
    break;
  case 4:
    pGVar1 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    vdim = dims[1];
    if (dims[0] < dims[1]) {
      vdim = dims[0];
    }
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,1,&vdim,"V",(int *)0x0);
    test_get_diagonal(pGVar1,g_v);
    break;
  case 5:
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    if (g_v == (GlobalArray *)0x0) {
      GA_Error("create failed: A",4);
    }
    test_norm1(g_v);
    goto LAB_001067cb;
  case 6:
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    test_norm_infinity(g_v);
    goto LAB_001067cb;
  case 7:
    pGVar1 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    pGVar2 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,pGVar1,"B");
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,pGVar1,"C");
    test_median(pGVar1,pGVar2,g_v,pGVar1);
    GA::GlobalArray::destroy(pGVar1);
    GA::GlobalArray::destroy(pGVar2);
    goto LAB_001067cb;
  case 8:
    pGVar1 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    pGVar2 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,pGVar1,"B");
    g_c = GA::GAServices::createGA((GAServices *)&GA::SERVICES,pGVar1,"C");
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,pGVar1,"M");
    test_median_patch(pGVar1,lo,hi,pGVar2,lo,hi,g_c,lo,hi,g_v,lo,hi);
    GA::GlobalArray::destroy(pGVar1);
    GA::GlobalArray::destroy(pGVar2);
    GA::GlobalArray::destroy(g_c);
    goto LAB_001067cb;
  case 9:
    pGVar1 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    vdim = dims[0];
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,1,&vdim,"V",(int *)0x0);
    test_scale_rows(pGVar1,g_v);
    break;
  case 10:
    pGVar1 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,2,dims,"A",(int *)0x0);
    vdim = dims[1];
    g_v = GA::GAServices::createGA((GAServices *)&GA::SERVICES,type,1,&vdim,"V",(int *)0x0);
    test_scale_cols(pGVar1,g_v);
    break;
  default:
    GA::GAServices::error((GAServices *)&GA::SERVICES,"test_function: wrong operation.",op);
  }
  GA::GlobalArray::destroy(pGVar1);
LAB_001067cb:
  GA::GlobalArray::destroy(g_v);
  return;
}

Assistant:

void
do_work (int type, int op) {
  GA::GlobalArray *g_a, *g_b, *g_c, *g_m, *g_v;
  int n = N;
  int dims[2] = { N,		/*N columns */
		  N + 2		/*N+2 rows */
  };
  int vdim;
  int lo[2], hi[2];

  lo[0] = 1;
  hi[0] = dims[0] - 1;
  lo[1] = 1;
  hi[1] = dims[1] - 1;

  switch (op)
    {

    case OP_SHIFT_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      test_shift_diagonal (g_a);
      g_a->destroy();
      break;
    case OP_SET_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = GA_MIN (dims[0], dims[1]);
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_set_diagonal (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_ADD_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = GA_MIN (dims[0], dims[1]);
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_add_diagonal (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_GET_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = GA_MIN (dims[0], dims[1]);
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_get_diagonal (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_NORM1:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      if (!g_a)
	GA_Error ((char *)"create failed: A", n);
      test_norm1 (g_a);
      g_a->destroy ();
      break;

    case OP_NORM_INFINITY:
      g_a = GA::SERVICES.createGA (type, 2, dims,(char *) "A", NULL);
      test_norm_infinity (g_a);
      g_a->destroy ();
      break;

    case OP_MEDIAN:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*duplicate g_a */
      g_b = GA::SERVICES.createGA (g_a, (char *)"B");      
      g_c = GA::SERVICES.createGA (g_a, (char *)"C");
#if 0 //test g_m is different from g_a, g_b, amd g_c
      g_m = GA::SERVICES.createGA (g_a, (char *)"M");
      test_median (g_a, g_b, g_c, g_m);
#else //test g_m = g_c
      test_median (g_a, g_b, g_c, g_a);
#endif
      g_a->destroy ();
      g_b->destroy ();
      g_c->destroy ();
#if 0 //test g_m is different from g_a, g_b, g_c
      g_m->destroy ();
#endif
      break;

    case OP_MEDIAN_PATCH:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*duplicate g_a */
      g_b = GA::SERVICES.createGA (g_a, (char *)"B");
      g_c = GA::SERVICES.createGA (g_a, (char *)"C");
      g_m = GA::SERVICES.createGA (g_a, (char *)"M");
      test_median_patch (g_a, lo, hi, g_b, lo, hi, g_c, lo, hi, g_m, lo, hi);
      g_a->destroy ();
      g_b->destroy ();
      g_c->destroy ();
      g_m->destroy ();
      break;
    case OP_SCALE_ROWS:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = dims[0];
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_scale_rows (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_SCALE_COLS:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = dims[1];
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_scale_cols (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;

    default:
      GA::SERVICES.error ((char *)"test_function: wrong operation.", op);
    }
}